

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O0

DeviceAPI * __thiscall
tvm::runtime::DeviceAPIManager::GetAPI(DeviceAPIManager *this,int type,bool allow_missing)

{
  reference ppDVar1;
  char *__s;
  DeviceAPI *pDVar2;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  byte local_1d;
  int local_1c;
  bool allow_missing_local;
  DeviceAPIManager *pDStack_18;
  int type_local;
  DeviceAPIManager *this_local;
  
  local_1d = allow_missing;
  local_1c = type;
  pDStack_18 = this;
  if (type < 0x80) {
    ppDVar1 = std::array<tvm::runtime::DeviceAPI_*,_32UL>::operator[](&this->api_,(long)type);
    if (*ppDVar1 == (value_type)0x0) {
      ppDVar1 = std::array<tvm::runtime::DeviceAPI_*,_32UL>::operator[](&this->api_,(long)local_1c);
      if (*ppDVar1 == (value_type)0x0) {
        __s = DeviceName(local_1c);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
        pDVar2 = GetAPI(this,&local_40,(bool)(local_1d & 1));
        ppDVar1 = std::array<tvm::runtime::DeviceAPI_*,_32UL>::operator[]
                            (&this->api_,(long)local_1c);
        *ppDVar1 = pDVar2;
        std::__cxx11::string::~string((string *)&local_40);
        std::allocator<char>::~allocator(&local_41);
        ppDVar1 = std::array<tvm::runtime::DeviceAPI_*,_32UL>::operator[]
                            (&this->api_,(long)local_1c);
        this_local = (DeviceAPIManager *)*ppDVar1;
      }
      else {
        ppDVar1 = std::array<tvm::runtime::DeviceAPI_*,_32UL>::operator[]
                            (&this->api_,(long)local_1c);
        this_local = (DeviceAPIManager *)*ppDVar1;
      }
    }
    else {
      ppDVar1 = std::array<tvm::runtime::DeviceAPI_*,_32UL>::operator[](&this->api_,(long)local_1c);
      this_local = (DeviceAPIManager *)*ppDVar1;
    }
  }
  else if (this->rpc_api_ == (DeviceAPI *)0x0) {
    if (this->rpc_api_ == (DeviceAPI *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"rpc",&local_79);
      pDVar2 = GetAPI(this,&local_78,(bool)(local_1d & 1));
      this->rpc_api_ = pDVar2;
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      this_local = (DeviceAPIManager *)this->rpc_api_;
    }
    else {
      this_local = (DeviceAPIManager *)this->rpc_api_;
    }
  }
  else {
    this_local = (DeviceAPIManager *)this->rpc_api_;
  }
  return (DeviceAPI *)this_local;
}

Assistant:

DeviceAPI *GetAPI(int type, bool allow_missing) {
    if (type < kRPCSessMask) {
      if (api_[type] != nullptr)
        return api_[type];
      /* [RISCV-DLR] multi-threading is not supported, so lock is unnecessary */
      //std::lock_guard<std::mutex> lock(mutex_);
      if (api_[type] != nullptr)
        return api_[type];
      api_[type] = GetAPI(DeviceName(type), allow_missing);
      return api_[type];
    } else {
      if (rpc_api_ != nullptr)
        return rpc_api_;
      /* [RISCV-DLR] multi-threading is not supported, so lock is unnecessary */
      //std::lock_guard<std::mutex> lock(mutex_);
      if (rpc_api_ != nullptr)
        return rpc_api_;
      rpc_api_ = GetAPI("rpc", allow_missing);
      return rpc_api_;
    }
  }